

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::Generate
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Context *context;
  long lVar1;
  undefined8 *puVar2;
  bool bVar3;
  int iVar4;
  JavaType type;
  mapped_type *pmVar5;
  Descriptor *pDVar6;
  ImmutableFieldGenerator *pIVar7;
  Descriptor *descriptor;
  ulong uVar8;
  ulong extraout_RDX;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *field;
  AlphaNum *a_02;
  FieldDescriptor *extraout_RDX_02;
  int j;
  long lVar9;
  int iVar10;
  string *this_00;
  int i_1;
  int i;
  java *this_01;
  long lVar11;
  long lVar12;
  SubstituteArg *in_stack_fffffffffffffcf8;
  ImmutableMessageGenerator messageGenerator;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_270;
  SubstituteArg local_250;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  string builder_type;
  SubstituteArg local_1c0;
  string local_190;
  string local_170;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &variables._M_t._M_impl.super__Rb_tree_header._M_header;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&messageGenerator,"static",(allocator *)&vars);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&variables,(key_type *)&messageGenerator);
  std::__cxx11::string::assign((char *)pmVar5);
  std::__cxx11::string::~string((string *)&messageGenerator);
  std::__cxx11::string::string((string *)&messageGenerator,"classname",(allocator *)&vars);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&variables,(key_type *)&messageGenerator);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  std::__cxx11::string::~string((string *)&messageGenerator);
  ExtraMessageInterfaces_abi_cxx11_
            ((string *)&messageGenerator,(java *)(this->super_MessageGenerator).descriptor_,
             descriptor);
  std::__cxx11::string::string((string *)&vars,"extra_interfaces",(allocator *)&local_250);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&variables,(key_type *)&vars);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&vars);
  std::__cxx11::string::~string((string *)&messageGenerator);
  GeneratedCodeVersionSuffix_abi_cxx11_();
  std::__cxx11::string::string((string *)&vars,"ver",(allocator *)&local_250);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&variables,(key_type *)&vars);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&vars);
  std::__cxx11::string::~string((string *)&messageGenerator);
  std::__cxx11::string::string((string *)&messageGenerator,"deprecation",(allocator *)&vars);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&variables,(key_type *)&messageGenerator);
  std::__cxx11::string::assign((char *)pmVar5);
  std::__cxx11::string::~string((string *)&messageGenerator);
  WriteMessageDocComment(printer,(this->super_MessageGenerator).descriptor_);
  pDVar6 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  std::__cxx11::string::string((string *)&messageGenerator,"",(allocator *)&vars);
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar6,true,(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&messageGenerator);
  builder_type._M_dataplus._M_p = (pointer)&builder_type.field_2;
  builder_type._M_string_length = 0;
  builder_type.field_2._M_local_buf[0] = '\0';
  if (*(int *)((this->super_MessageGenerator).descriptor_ + 0x78) < 1) {
    io::Printer::Print(printer,&variables,
                       "$deprecation$public $static$final class $classname$ extends\n");
    io::Printer::Annotate<google::protobuf::Descriptor>
              (printer,"classname",(this->super_MessageGenerator).descriptor_);
    io::Printer::Print(printer,&variables,
                       "    com.google.protobuf.GeneratedMessage$ver$ implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    GeneratedCodeVersionSuffix_abi_cxx11_();
    vars._M_t._M_impl._0_8_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
    local_250.text_ = (char *)0x0;
    local_250.size_ = -1;
    local_1c0.text_ = (char *)0x0;
    local_1c0.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
         (_func_int **)local_270._M_dataplus._M_p;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    messageGenerator.super_MessageGenerator.descriptor_._0_4_ =
         (undefined4)local_270._M_string_length;
    local_120.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&local_170,(strings *)"com.google.protobuf.GeneratedMessage$0.Builder<?>",
               (char *)&messageGenerator,(SubstituteArg *)&vars,&local_250,&local_1c0,&local_150,
               &local_60,&local_90,&local_c0,&local_f0,&local_120,in_stack_fffffffffffffcf8);
    this_00 = &local_170;
    std::__cxx11::string::operator=((string *)&builder_type,(string *)this_00);
  }
  else {
    io::Printer::Print(printer,&variables,
                       "$deprecation$public $static$final class $classname$ extends\n");
    io::Printer::Annotate<google::protobuf::Descriptor>
              (printer,"classname",(this->super_MessageGenerator).descriptor_);
    io::Printer::Print(printer,&variables,
                       "    com.google.protobuf.GeneratedMessage$ver$.ExtendableMessage<\n      $classname$> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_270,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
    messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
         (_func_int **)local_270._M_dataplus._M_p;
    messageGenerator.super_MessageGenerator.descriptor_._0_4_ =
         (undefined4)local_270._M_string_length;
    GeneratedCodeVersionSuffix_abi_cxx11_();
    local_250.text_ = (char *)0x0;
    local_250.size_ = -1;
    local_1c0.text_ = (char *)0x0;
    local_1c0.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    vars._M_t._M_impl._0_8_ = local_190._M_dataplus._M_p;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         (_Rb_tree_color)local_190._M_string_length;
    local_120.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&local_170,
               (strings *)"com.google.protobuf.GeneratedMessage$1.ExtendableBuilder<$0, ?>",
               (char *)&messageGenerator,(SubstituteArg *)&vars,&local_250,&local_1c0,&local_150,
               &local_60,&local_90,&local_c0,&local_f0,&local_120,in_stack_fffffffffffffcf8);
    std::__cxx11::string::operator=((string *)&builder_type,(string *)&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    this_00 = &local_190;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&local_270);
  io::Printer::Print<>(printer,"private static final long serialVersionUID = 0L;\n");
  io::Printer::Indent(printer);
  io::Printer::Print<char[10],std::__cxx11::string,char[12],std::__cxx11::string>
            (printer,
             "// Use $classname$.newBuilder() to construct.\nprivate $classname$($buildertype$ builder) {\n  super(builder);\n}\n"
             ,(char (*) [10])0x3a498c,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (this->super_MessageGenerator).descriptor_,(char (*) [12])"buildertype",&builder_type)
  ;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"private $classname$() {\n",(char (*) [10])0x3a498c,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (this->super_MessageGenerator).descriptor_);
  io::Printer::Indent(printer);
  GenerateInitializers(this,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  io::Printer::Print(printer,&variables,
                     "@java.lang.Override\n@SuppressWarnings({\"unused\"})\nprotected java.lang.Object newInstance(\n    UnusedPrivateParameter unused) {\n  return new $classname$();\n}\n\n"
                    );
  io::Printer::Print<>
            (printer,
             "@java.lang.Override\npublic final com.google.protobuf.UnknownFieldSet\ngetUnknownFields() {\n  return this.unknownFields;\n}\n"
            );
  bVar3 = Context::HasGeneratedMethods(this->context_,(this->super_MessageGenerator).descriptor_);
  if (bVar3) {
    GenerateParsingConstructor(this,printer);
  }
  GenerateDescriptorMethods(this,printer);
  lVar9 = 0;
  for (lVar11 = 0; pDVar6 = (this->super_MessageGenerator).descriptor_,
      lVar11 < *(int *)(pDVar6 + 0x74); lVar11 = lVar11 + 1) {
    EnumGenerator::EnumGenerator
              ((EnumGenerator *)&messageGenerator,
               (EnumDescriptor *)(*(long *)(pDVar6 + 0x40) + lVar9),true,this->context_);
    EnumGenerator::Generate((EnumGenerator *)&messageGenerator,printer);
    EnumGenerator::~EnumGenerator((EnumGenerator *)&messageGenerator);
    lVar9 = lVar9 + 0x50;
  }
  lVar9 = 0;
  for (lVar11 = 0; lVar11 < *(int *)(pDVar6 + 0x70); lVar11 = lVar11 + 1) {
    if (*(char *)(*(long *)(*(long *)(pDVar6 + 0x38) + 0x20 + lVar9) + 0x4b) == '\0') {
      ImmutableMessageGenerator
                (&messageGenerator,(Descriptor *)(*(long *)(pDVar6 + 0x38) + lVar9),this->context_);
      GenerateInterface(&messageGenerator,printer);
      Generate(&messageGenerator,printer);
      ~ImmutableMessageGenerator(&messageGenerator);
      pDVar6 = (this->super_MessageGenerator).descriptor_;
    }
    lVar9 = lVar9 + 0x90;
  }
  lVar9 = 0;
  iVar10 = 0;
  for (lVar11 = 0; lVar11 < *(int *)(pDVar6 + 0x68); lVar11 = lVar11 + 1) {
    pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (&this->field_generators_,
                        (FieldDescriptor *)(*(long *)(pDVar6 + 0x28) + lVar9));
    iVar4 = (*pIVar7->_vptr_ImmutableFieldGenerator[2])(pIVar7);
    iVar10 = iVar10 + iVar4;
    pDVar6 = (this->super_MessageGenerator).descriptor_;
    lVar9 = lVar9 + 0x98;
  }
  iVar4 = (iVar10 + 0x1f) / 0x20;
  uVar8 = (long)(iVar10 + 0x1f) % 0x20 & 0xffffffff;
  this_01 = (java *)0x0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  for (; iVar4 != (int)this_01; this_01 = (java *)(ulong)((int)this_01 + 1)) {
    GetBitFieldName_abi_cxx11_((string *)&messageGenerator,this_01,(int)uVar8);
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,"private int $bit_field_name$;\n",(char (*) [15])"bit_field_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &messageGenerator);
    std::__cxx11::string::~string((string *)&messageGenerator);
    uVar8 = extraout_RDX;
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar9 = 0; pDVar6 = (this->super_MessageGenerator).descriptor_,
      lVar9 < *(int *)(pDVar6 + 0x6c); lVar9 = lVar9 + 1) {
    lVar12 = lVar9 * 0x30;
    Context::GetOneofGeneratorInfo
              (this->context_,(OneofDescriptor *)(*(long *)(pDVar6 + 0x30) + lVar12));
    std::__cxx11::string::string((string *)&messageGenerator,"oneof_name",(allocator *)&local_250);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&messageGenerator);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&messageGenerator);
    Context::GetOneofGeneratorInfo
              (this->context_,
               (OneofDescriptor *)
               (*(long *)((this->super_MessageGenerator).descriptor_ + 0x30) + lVar12));
    std::__cxx11::string::string
              ((string *)&messageGenerator,"oneof_capitalized_name",(allocator *)&local_250);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&messageGenerator);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&messageGenerator);
    lVar11 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x30);
    strings::AlphaNum::AlphaNum
              ((AlphaNum *)&messageGenerator,
               (int)(((lVar11 + lVar12) - *(long *)(*(long *)(lVar11 + 0x10 + lVar12) + 0x30)) /
                    0x30));
    StrCat_abi_cxx11_((string *)&local_250,(protobuf *)&messageGenerator,a);
    std::__cxx11::string::string((string *)&local_1c0,"oneof_index",(allocator *)&local_150);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&local_1c0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_250);
    io::Printer::Print(printer,&vars,
                       "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                      );
    io::Printer::Print(printer,&vars,
                       "public enum $oneof_capitalized_name$Case\n    implements com.google.protobuf.Internal.EnumLite,\n        com.google.protobuf.AbstractMessage.InternalOneOfEnum {\n"
                      );
    io::Printer::Indent(printer);
    for (lVar11 = 0; lVar1 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x30),
        lVar11 < *(int *)(lVar1 + 0x18 + lVar12); lVar11 = lVar11 + 1) {
      puVar2 = *(undefined8 **)(*(long *)(lVar1 + lVar12 + 0x20) + lVar11 * 8);
      local_150.text_ = "";
      if (*(char *)(puVar2[0xf] + 0x4e) != '\0') {
        local_150.text_ = "@java.lang.Deprecated ";
      }
      ToUpper((string *)&local_250,(string *)*puVar2);
      strings::AlphaNum::AlphaNum((AlphaNum *)&messageGenerator,*(int *)((long)puVar2 + 0x44));
      StrCat_abi_cxx11_((string *)&local_1c0,(protobuf *)&messageGenerator,a_00);
      io::Printer::
      Print<char[12],char_const*,char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                (printer,"$deprecation$$field_name$($field_number$),\n",(char (*) [12])"deprecation"
                 ,&local_150.text_,(char (*) [11])0x3aba68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_250,
                 (char (*) [13])"field_number",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_250);
    }
    std::__cxx11::string::string((string *)&local_250,"oneof_name",(allocator *)&local_1c0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&local_250);
    ToUpper((string *)&messageGenerator,pmVar5);
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,"$cap_oneof_name$_NOT_SET(0);\n",(char (*) [15])"cap_oneof_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &messageGenerator);
    std::__cxx11::string::~string((string *)&messageGenerator);
    std::__cxx11::string::~string((string *)&local_250);
    io::Printer::Print(printer,&vars,
                       "private final int value;\nprivate $oneof_capitalized_name$Case(int value) {\n  this.value = value;\n}\n"
                      );
    io::Printer::Print(printer,&vars,
                       "/**\n * @param value The number of the enum to look for.\n * @return The enum associated with the given number.\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $oneof_capitalized_name$Case valueOf(int value) {\n  return forNumber(value);\n}\n\npublic static $oneof_capitalized_name$Case forNumber(int value) {\n  switch (value) {\n"
                      );
    for (lVar11 = 0; lVar1 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x30),
        lVar11 < *(int *)(lVar1 + 0x18 + lVar12); lVar11 = lVar11 + 1) {
      puVar2 = *(undefined8 **)(*(long *)(lVar1 + lVar12 + 0x20) + lVar11 * 8);
      strings::AlphaNum::AlphaNum((AlphaNum *)&messageGenerator,*(int *)((long)puVar2 + 0x44));
      StrCat_abi_cxx11_((string *)&local_250,(protobuf *)&messageGenerator,a_01);
      ToUpper((string *)&local_1c0,(string *)*puVar2);
      io::Printer::Print<char[13],std::__cxx11::string,char[11],std::__cxx11::string>
                (printer,"    case $field_number$: return $field_name$;\n",
                 (char (*) [13])"field_number",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_250,
                 (char (*) [11])0x3aba68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_250);
    }
    std::__cxx11::string::string((string *)&local_250,"oneof_name",(allocator *)&local_1c0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&local_250);
    ToUpper((string *)&messageGenerator,pmVar5);
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,
               "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
               ,(char (*) [15])"cap_oneof_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &messageGenerator);
    std::__cxx11::string::~string((string *)&messageGenerator);
    std::__cxx11::string::~string((string *)&local_250);
    io::Printer::Outdent(printer);
    io::Printer::Print<>(printer,"};\n\n");
    io::Printer::Print(printer,&vars,
                       "public $oneof_capitalized_name$Case\nget$oneof_capitalized_name$Case() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\n"
                      );
  }
  bVar3 = IsAnyMessage(pDVar6);
  field = extraout_RDX_00;
  if (bVar3) {
    io::Printer::Print<>
              (printer,
               "private static String getTypeUrl(\n    java.lang.String typeUrlPrefix,\n    com.google.protobuf.Descriptors.Descriptor descriptor) {\n  return typeUrlPrefix.endsWith(\"/\")\n      ? typeUrlPrefix + descriptor.getFullName()\n      : typeUrlPrefix + \"/\" + descriptor.getFullName();\n}\n\nprivate static String getTypeNameFromTypeUrl(\n    java.lang.String typeUrl) {\n  int pos = typeUrl.lastIndexOf(\'/\');\n  return pos == -1 ? \"\" : typeUrl.substring(pos + 1);\n}\n\npublic static <T extends com.google.protobuf.Message> Any pack(\n    T message) {\n  return Any.newBuilder()\n      .setTypeUrl(getTypeUrl(\"type.googleapis.com\",\n                             message.getDescriptorForType()))\n      .setValue(message.toByteString())\n      .build();\n}\n\n/**\n * Packs a message using the given type URL prefix. The type URL will\n * be constructed by concatenating the message type\'s full name to the\n * prefix with an optional \"/\" separator if the prefix doesn\'t end\n * with \"/\" already.\n */\npublic static <T extends com.google.protobuf.Message> Any pack(\n    T message, java.lang.String typeUrlPrefix) {\n  return Any.newBuilder()\n      .setTypeUrl(getTypeUrl(typeUrlPrefix,\n                             message.getDescriptorForType()))\n      .setValue(message.toByteString())\n      .build();\n}\n\npublic <T extends com.google.protobuf.Message> boolean is(\n    java.lang.Class<T> clazz) {\n  T defaultInstance =\n      com.google.protobuf.Internal.getDefaultInstance(clazz);\n  return getTypeNameFromTypeUrl(getTypeUrl()).equals(\n      defaultInstance.getDescriptorForType().getFullName());\n}\n\nprivate volatile com.google.protobuf.Message cachedUnpackValue;\n\n@java.lang.SuppressWarnings(\"unchecked\")\npublic <T extends com.google.protobuf.Message> T unpack(\n    java.lang.Class<T> clazz)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  boolean invalidClazz = false;\n  if (cachedUnpackValue != null) {\n    if (cachedUnpackValue.getClass() == clazz) {\n      return (T) cachedUnpackValue;\n    }\n    invalidClazz = true;\n  }\n  if (invalidClazz || !is(clazz)) {\n    t..." /* TRUNCATED STRING LITERAL */
              );
    field = extraout_RDX_01;
  }
  lVar9 = 0;
  for (lVar11 = 0; pDVar6 = (this->super_MessageGenerator).descriptor_,
      lVar11 < *(int *)(pDVar6 + 0x68); lVar11 = lVar11 + 1) {
    FieldConstantName_abi_cxx11_
              ((string *)&local_250,(java *)(*(long *)(pDVar6 + 0x28) + lVar9),field);
    strings::AlphaNum::AlphaNum
              ((AlphaNum *)&messageGenerator,
               *(int *)(*(long *)((this->super_MessageGenerator).descriptor_ + 0x28) + 0x44 + lVar9)
              );
    StrCat_abi_cxx11_((string *)&local_1c0,(protobuf *)&messageGenerator,a_02);
    io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
              (printer,"public static final int $constant_name$ = $number$;\n",
               (char (*) [14])0x3a8ffc,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_250,
               (char (*) [7])0x3abb91,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_250);
    pIVar7 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (&this->field_generators_,
                        (FieldDescriptor *)
                        (*(long *)((this->super_MessageGenerator).descriptor_ + 0x28) + lVar9));
    (*pIVar7->_vptr_ImmutableFieldGenerator[5])(pIVar7,printer);
    io::Printer::Print<>(printer,"\n");
    lVar9 = lVar9 + 0x98;
    field = extraout_RDX_02;
  }
  bVar3 = Context::HasGeneratedMethods(this->context_,pDVar6);
  if (bVar3) {
    GenerateIsInitialized(this,printer);
    GenerateMessageSerializationMethods(this,printer);
    GenerateEqualsAndHashCode(this,printer);
  }
  GenerateParseFromMethods(this,printer);
  GenerateBuilder(this,printer);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n",
             (char (*) [10])0x3a30d1,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              ((this->super_MessageGenerator).descriptor_ + 8));
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"private static final $classname$ DEFAULT_INSTANCE;\n",(char (*) [10])0x3a498c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&messageGenerator)
  ;
  std::__cxx11::string::~string((string *)&messageGenerator);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"static {\n  DEFAULT_INSTANCE = new $classname$();\n}\n\n",
             (char (*) [10])0x3a498c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&messageGenerator)
  ;
  std::__cxx11::string::~string((string *)&messageGenerator);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n",
             (char (*) [10])0x3a498c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&messageGenerator)
  ;
  std::__cxx11::string::~string((string *)&messageGenerator);
  bVar3 = IsWrappersProtoFile(*(FileDescriptor **)
                               ((this->super_MessageGenerator).descriptor_ + 0x10));
  if (bVar3) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              ((string *)&messageGenerator,this->name_resolver_,
               (this->super_MessageGenerator).descriptor_);
    type = GetJavaType(*(FieldDescriptor **)((this->super_MessageGenerator).descriptor_ + 0x28));
    local_250.text_ = PrimitiveTypeName(type);
    io::Printer::Print<char[10],std::__cxx11::string,char[11],char_const*>
              (printer,
               "public static $classname$ of($field_type$ value) {\n  return newBuilder().setValue(value).build();\n}\n\n"
               ,(char (*) [10])0x3a498c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &messageGenerator,(char (*) [11])0x3bb088,&local_250.text_);
    std::__cxx11::string::~string((string *)&messageGenerator);
  }
  GenerateParser(this,printer);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "@java.lang.Override\npublic $classname$ getDefaultInstanceForType() {\n  return DEFAULT_INSTANCE;\n}\n\n"
             ,(char (*) [10])0x3a498c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&messageGenerator)
  ;
  std::__cxx11::string::~string((string *)&messageGenerator);
  lVar9 = 0;
  for (lVar11 = 0; pDVar6 = (this->super_MessageGenerator).descriptor_,
      lVar11 < *(int *)(pDVar6 + 0x7c); lVar11 = lVar11 + 1) {
    ImmutableExtensionGenerator::ImmutableExtensionGenerator
              ((ImmutableExtensionGenerator *)&messageGenerator,
               (FieldDescriptor *)(*(long *)(pDVar6 + 0x50) + lVar9),this->context_);
    ImmutableExtensionGenerator::Generate((ImmutableExtensionGenerator *)&messageGenerator,printer);
    ImmutableExtensionGenerator::~ImmutableExtensionGenerator
              ((ImmutableExtensionGenerator *)&messageGenerator);
    lVar9 = lVar9 + 0x98;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  std::__cxx11::string::~string((string *)&builder_type);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&variables._M_t);
  return;
}

Assistant:

void ImmutableMessageGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  std::map<std::string, std::string> variables;
  variables["static"] = is_own_file ? " " : " static ";
  variables["classname"] = descriptor_->name();
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["ver"] = GeneratedCodeVersionSuffix();
  variables["deprecation"] =
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);

  // The builder_type stores the super type name of the nested Builder class.
  std::string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(
        variables,
        "    com.google.protobuf.GeneratedMessage$ver$.ExtendableMessage<\n"
        "      $classname$> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");
    builder_type = strings::Substitute(
        "com.google.protobuf.GeneratedMessage$1.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_),
        GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(variables,
                   "    com.google.protobuf.GeneratedMessage$ver$ implements\n"
                   "    $extra_interfaces$\n"
                   "    $classname$OrBuilder {\n");
    builder_type =
        strings::Substitute("com.google.protobuf.GeneratedMessage$0.Builder<?>",
                            GeneratedCodeVersionSuffix());
  }
  printer->Print("private static final long serialVersionUID = 0L;\n");

  printer->Indent();
  // Using builder_type, instead of Builder, prevents the Builder class from
  // being loaded into PermGen space when the default instance is created.
  // This optimizes the PermGen space usage for clients that do not modify
  // messages.
  printer->Print(
      "// Use $classname$.newBuilder() to construct.\n"
      "private $classname$($buildertype$ builder) {\n"
      "  super(builder);\n"
      "}\n",
      "classname", descriptor_->name(), "buildertype", builder_type);
  printer->Print("private $classname$() {\n", "classname", descriptor_->name());
  printer->Indent();
  GenerateInitializers(printer);
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  printer->Print(variables,
                 "@java.lang.Override\n"
                 "@SuppressWarnings({\"unused\"})\n"
                 "protected java.lang.Object newInstance(\n"
                 "    UnusedPrivateParameter unused) {\n"
                 "  return new $classname$();\n"
                 "}\n"
                 "\n");

  printer->Print(
      "@java.lang.Override\n"
      "public final com.google.protobuf.UnknownFieldSet\n"
      "getUnknownFields() {\n"
      "  return this.unknownFields;\n"
      "}\n");

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateParsingConstructor(printer);
  }

  GenerateDescriptorMethods(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumGenerator(descriptor_->enum_type(i), true, context_).Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageGenerator messageGenerator(descriptor_->nested_type(i),
                                               context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  // oneof
  std::map<std::string, std::string> vars;
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    vars["oneof_name"] =
        context_->GetOneofGeneratorInfo(descriptor_->oneof_decl(i))->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(descriptor_->oneof_decl(i))
            ->capitalized_name;
    vars["oneof_index"] = StrCat(descriptor_->oneof_decl(i)->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
                   "private int $oneof_name$Case_ = 0;\n"
                   "private java.lang.Object $oneof_name$_;\n");
    // OneofCase enum
    printer->Print(
        vars,
        "public enum $oneof_capitalized_name$Case\n"
        // TODO(dweis): Remove EnumLite when we want to break compatibility with
        // 3.x users
        "    implements com.google.protobuf.Internal.EnumLite,\n"
        "        com.google.protobuf.AbstractMessage.InternalOneOfEnum {\n");
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
          "$deprecation$$field_name$($field_number$),\n", "deprecation",
          field->options().deprecated() ? "@java.lang.Deprecated " : "",
          "field_name", ToUpper(field->name()), "field_number",
          StrCat(field->number()));
    }
    printer->Print("$cap_oneof_name$_NOT_SET(0);\n", "cap_oneof_name",
                   ToUpper(vars["oneof_name"]));
    printer->Print(vars,
                   "private final int value;\n"
                   "private $oneof_capitalized_name$Case(int value) {\n"
                   "  this.value = value;\n"
                   "}\n");
    printer->Print(
        vars,
        "/**\n"
        " * @param value The number of the enum to look for.\n"
        " * @return The enum associated with the given number.\n"
        " * @deprecated Use {@link #forNumber(int)} instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
        "  return forNumber(value);\n"
        "}\n"
        "\n"
        "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
        "  switch (value) {\n");
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print("    case $field_number$: return $field_name$;\n",
                     "field_number", StrCat(field->number()),
                     "field_name", ToUpper(field->name()));
    }
    printer->Print(
        "    case 0: return $cap_oneof_name$_NOT_SET;\n"
        "    default: return null;\n"
        "  }\n"
        "}\n"
        "public int getNumber() {\n"
        "  return this.value;\n"
        "}\n",
        "cap_oneof_name", ToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
                   "public $oneof_capitalized_name$Case\n"
                   "get$oneof_capitalized_name$Case() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n"
                   "\n");
  }

  if (IsAnyMessage(descriptor_)) {
    GenerateAnyMethods(printer);
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
                   "constant_name", FieldConstantName(descriptor_->field(i)),
                   "number", StrCat(descriptor_->field(i)->number()));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer);
    GenerateMessageSerializationMethods(printer);
    GenerateEqualsAndHashCode(printer);
  }


  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(class_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print("private static final $classname$ DEFAULT_INSTANCE;\n",
                 "classname",
                 name_resolver_->GetImmutableClassName(descriptor_));
  printer->Print(
      "static {\n"
      "  DEFAULT_INSTANCE = new $classname$();\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // 'of' method for Wrappers
  if (IsWrappersProtoFile(descriptor_->file())) {
    printer->Print(
        "public static $classname$ of($field_type$ value) {\n"
        "  return newBuilder().setValue(value).build();\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "field_type", PrimitiveTypeName(GetJavaType(descriptor_->field(0))));
  }

  GenerateParser(printer);

  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ getDefaultInstanceForType() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}